

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEFStreamObjectHelper.cc
# Opt level: O3

QPDFEFStreamObjectHelper * __thiscall
QPDFEFStreamObjectHelper::setCreationDate(QPDFEFStreamObjectHelper *this,string *date)

{
  QPDFObjectHandle QStack_48;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"/CreationDate","");
  QPDFObjectHandle::newString(&QStack_48,date);
  setParam(this,&local_38,&QStack_48);
  if (QStack_48.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (QStack_48.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

QPDFEFStreamObjectHelper&
QPDFEFStreamObjectHelper::setCreationDate(std::string const& date)
{
    setParam("/CreationDate", QPDFObjectHandle::newString(date));
    return *this;
}